

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

int32_t testing::internal::Int32FromGTestEnv(char *flag,int32_t default_value)

{
  undefined1 uVar1;
  byte bVar2;
  char *pcVar3;
  Message *this;
  undefined8 uVar4;
  int32_t in_ESI;
  int32_t *in_stack_00000018;
  char *in_stack_00000020;
  Message *in_stack_00000028;
  int32_t result;
  char *string_value;
  string env_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  Message *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffffc8;
  
  FlagToEnvVar_abi_cxx11_(in_stack_ffffffffffffffc8);
  std::__cxx11::string::c_str();
  pcVar3 = posix::GetEnv((char *)0x115b12);
  if (pcVar3 != (char *)0x0) {
    Message::Message(in_stack_ffffffffffffff80);
    Message::operator<<((Message *)
                        CONCAT17(in_stack_ffffffffffffff57,
                                 CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
                        (char (*) [22])in_stack_ffffffffffffff48);
    this = Message::operator<<((Message *)
                               CONCAT17(in_stack_ffffffffffffff57,
                                        CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50
                                                )),in_stack_ffffffffffffff48);
    uVar1 = ParseInt32(in_stack_00000028,in_stack_00000020,in_stack_00000018);
    bVar2 = uVar1 ^ 0xff;
    Message::~Message((Message *)0x115bcf);
    if ((bVar2 & 1) != 0) {
      Message::Message(in_stack_ffffffffffffff80);
      Message::operator<<((Message *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_ffffffffffffff50)),
                          (int *)in_stack_ffffffffffffff48);
      Message::GetString_abi_cxx11_(this);
      uVar4 = std::__cxx11::string::c_str();
      printf("The default value %s is used.\n",uVar4);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
      Message::~Message((Message *)0x115c41);
      fflush(_stdout);
    }
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return in_ESI;
}

Assistant:

int32_t Int32FromGTestEnv(const char* flag, int32_t default_value) {
#if defined(GTEST_GET_INT32_FROM_ENV_)
  return GTEST_GET_INT32_FROM_ENV_(flag, default_value);
#else
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == nullptr) {
    // The environment variable is not set.
    return default_value;
  }

  int32_t result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var,
                  string_value, &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
#endif  // defined(GTEST_GET_INT32_FROM_ENV_)
}